

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmselect.c
# Opt level: O3

void libcmselect_LTX_remove_select(CMtrans_services svc,select_data_ptr *sdp,int fd)

{
  ulong *puVar1;
  FunctionListElement *pFVar2;
  FunctionListElement *pFVar3;
  byte bVar4;
  select_data_ptr psVar5;
  int iVar6;
  
  psVar5 = *sdp;
  if (psVar5 == (select_data_ptr)0x0) {
    init_select_data(svc,sdp,(CManager_conflict)0x0);
    psVar5 = *sdp;
  }
  psVar5->select_consistency_number = psVar5->select_consistency_number + 1;
  bVar4 = (byte)fd & 0x3f;
  iVar6 = fd + 0x3f;
  if (-1 < fd) {
    iVar6 = fd;
  }
  puVar1 = (ulong *)((long)psVar5->fdset + (long)(iVar6 >> 6) * 8);
  *puVar1 = *puVar1 & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
  pFVar3 = psVar5->select_items;
  pFVar2 = pFVar3 + fd;
  pFVar2->func = (select_list_func)0x0;
  pFVar2->arg1 = (void *)0x0;
  pFVar3[fd].arg2 = (void *)0x0;
  wake_server_thread((select_data_ptr)(ulong)(uint)psVar5->wake_write_fd);
  return;
}

Assistant:

extern void
libcmselect_LTX_remove_select(CMtrans_services svc, select_data_ptr *sdp, int fd)
{
    select_data_ptr sd = *((select_data_ptr *)sdp);
    if (sd == NULL) {
	init_select_data(svc, (select_data_ptr*)sdp, (CManager)NULL);
	sd = *((select_data_ptr *)sdp);
    }
    sd->select_consistency_number++;
    FD_CLR(fd, (fd_set *) sd->fdset);
    sd->select_items[fd].func = NULL;
    sd->select_items[fd].arg1 = NULL;
    sd->select_items[fd].arg2 = NULL;
    wake_server_thread(sd);
}